

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall BufferedReader::thread_main(BufferedReader *this)

{
  thread_main((BufferedReader *)
              &this[-1].m_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  return;
}

Assistant:

void BufferedReader::thread_main()
{
    try
    {
        while (!m_terminated)
        {
            const int readerID = m_readQueue.pop();
            if (m_terminated)
            {
                break;
            }
            ReaderData* data = getReader(readerID);
            if (data)
            {
                uint8_t* buffer = data->m_nextBlock[data->m_bufferIndex] + data->m_readOffset;
                if (!data->m_deleted)
                {
                    int bytesReaded = data->readBlock(buffer, data->m_blockSize);
                    if (data->m_lastBlock)
                    {
                        data->m_lastBlock = false;
                        data->m_firstBlock = true;
                    }
                    else if (data->m_firstBlock)
                    {
                        data->m_firstBlock = false;
                    }

                    if (bytesReaded <= 0 || (bytesReaded < static_cast<int>(data->m_blockSize) && data->itr))
                    {
                        if (data->itr)
                        {
                            std::string nextFileName = data->itr->getNextName();
                            if (nextFileName != data->m_streamName)
                            {
                                data->closeStream();
                                data->m_streamName = nextFileName;
                                if (!data->m_streamName.empty() && data->openStream())
                                {
                                    if (bytesReaded == 0)
                                    {
                                        // data->m_nextFileInfo = NEXT_FILE_FIRST_BLOCK;
                                        data->m_firstBlock = true;
                                        bytesReaded = data->readBlock(buffer, m_blockSize);
                                        if (bytesReaded < static_cast<int>(m_blockSize))
                                        {
                                            data->m_eof = true;
                                            data->m_lastBlock = true;
                                        }
                                    }
                                    else
                                    {
                                        data->m_lastBlock = true;
                                    }
                                }
                                else
                                    data->m_eof = true;
                            }
                        }
                        else
                        {
                            data->m_eof = true;
                        }
                    }

                    data->m_blockSize = m_blockSize;
                    if (bytesReaded == 0)
                    {
                        data->m_eof = true;
                    }

                    {
                        std::lock_guard lk(m_readMtx);
                        data->m_nextBlockSize = bytesReaded;
                        m_readCond.notify_one();
                    }
                }

                {
                    std::lock_guard lock(m_readersMtx);
                    data->m_atQueue--;
                    if (data->m_deleted && data->m_atQueue == 0)
                    {
                        delete data;
                        m_readers.erase(readerID);
                    }
                }
            }
        }
    }
    catch (std::exception& e)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws exception: " << e.what());
    }
    catch (...)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws unknown exception");
    }
}